

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Wood.cpp
# Opt level: O3

void __thiscall Wood::apply(Wood *this,Vector *p,SurfaceData *t)

{
  double dVar1;
  undefined1 auVar2 [16];
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  dVar3 = p->x * (this->super_Texture).scale.x + (this->super_Texture).offs.x;
  dVar6 = p->y * (this->super_Texture).scale.y + (this->super_Texture).offs.y;
  dVar5 = (this->super_Texture).turb;
  dVar1 = this->ring_spacing;
  dVar4 = turbulence(p,(this->super_Texture).octaves);
  dVar5 = sin(dVar4 * dVar5 + SQRT(dVar3 * dVar3 + dVar6 * dVar6) * dVar1);
  dVar6 = pow((dVar5 + 1.0) * 0.5,(double)this->squeeze);
  dVar3 = 1.0 - dVar6;
  dVar5 = dVar6 * 0.05 + dVar3 * 0.6;
  dVar1 = dVar6 * 0.01 + dVar3 * 0.24;
  auVar2._8_4_ = SUB84(dVar1,0);
  auVar2._0_8_ = dVar5;
  auVar2._12_4_ = (int)((ulong)dVar1 >> 0x20);
  (t->color).x = dVar5;
  (t->color).y = (double)auVar2._8_8_;
  (t->color).z = dVar6 * 0.005 + dVar3 * 0.1;
  t->ks = (dVar6 * 0.3 + 0.7) * t->ks;
  return;
}

Assistant:

void Wood::apply( Vector& p, Grayzer::SurfaceData& t )
{
   double x = p.x * scale.x + offs.x;
   double y = p.y * scale.y + offs.y;
   double s = pow(   sineWave( ring_spacing * sqrt(  x *   x +   y *   y )   +
            turb  * turbulence(p,   octaves) ), squeeze  );

   t.color  = LightWood * (1 - s) + DarkWood * s;
   t.ks *=  0.3   * s   + 0.7;
}